

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_impl.c
# Opt level: O0

void plugin_destroy(plugin p)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (in_RDI[4] != 0) {
      (*(code *)in_RDI[4])(in_RDI);
    }
    plugin_descriptor_destroy((plugin_descriptor)0x120702);
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void plugin_destroy(plugin p)
{
	if (p != NULL)
	{
		if (p->dtor != NULL)
		{
			p->dtor(p);
		}

		plugin_descriptor_destroy(p->descriptor);

		if (p->name != NULL)
		{
			free(p->name);
		}

		free(p);
	}
}